

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

void __thiscall
duckdb::FilterCombiner::GenerateFilters
          (FilterCombiner *this,
          function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
          *callback)

{
  ExpressionType *args;
  map<unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  *this_00;
  _Base_ptr *this_01;
  pointer puVar1;
  FilterCombiner *pFVar2;
  _Base_ptr p_Var3;
  reference pvVar4;
  reference pvVar5;
  idx_t iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong __n;
  _Base_ptr *this_02;
  ulong uVar9;
  pointer puVar10;
  bool upper_inclusive;
  bool lower_inclusive;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_d8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d0;
  long *local_c8;
  optional_idx lower_index;
  optional_idx upper_index;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Base_ptr local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  FilterCombiner *local_68;
  map<unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  *local_60;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  _Base_ptr local_50;
  ulong local_48;
  _Base_ptr local_40;
  unsigned_long equivalence_set;
  
  puVar1 = (this->remaining_filters).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  for (puVar10 = (this->remaining_filters).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    local_70._M_head_impl =
         (puVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
    ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_70);
    if (local_70._M_head_impl != (Expression *)0x0) {
      (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_70._M_head_impl = (Expression *)0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::clear(&(this->remaining_filters).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         );
  p_Var7 = (local_68->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(local_68->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60 = &local_68->constant_values;
  do {
    pFVar2 = local_68;
    if (p_Var7 == local_50) {
      this_00 = &local_68->equivalence_map;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(local_68->stored_expressions)._M_h);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(pFVar2->equivalence_set_map)._M_h);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
      ::clear(&local_60->_M_t);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
      ::clear(&this_00->_M_t);
      return;
    }
    equivalence_set = *(unsigned_long *)(p_Var7 + 1);
    this_01 = &p_Var7[1]._M_parent;
    local_40 = (_Base_ptr)
               ::std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
               ::find(&local_60->_M_t,&equivalence_set);
    this_02 = &local_40[1]._M_parent;
    uVar9 = 0;
    local_78 = p_Var7;
LAB_015bd84c:
    __n = uVar9;
    p_Var8 = p_Var7[1]._M_parent;
    p_Var3 = p_Var7[1]._M_left;
    if (__n < (ulong)((long)p_Var3 - (long)p_Var8 >> 3)) {
      uVar9 = __n + 1;
      local_48 = uVar9;
      for (; uVar9 < (ulong)((long)p_Var3 - (long)p_Var8 >> 3); uVar9 = uVar9 + 1) {
        local_d8._M_head_impl._0_1_ = 0x19;
        pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,__n)
        ;
        (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&upper_index);
        pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,
                            uVar9);
        (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])((duckdb *)&local_c8);
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&lower_index,(ExpressionType *)&local_d8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &upper_index,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_c8);
        if (local_c8 != (long *)0x0) {
          (**(code **)(*local_c8 + 8))();
        }
        if (upper_index.index != 0) {
          (**(code **)(*(long *)upper_index.index + 8))();
        }
        local_80._M_head_impl = (Expression *)lower_index.index;
        lower_index.index = 0;
        ::std::
        function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
        ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_80);
        if (local_80._M_head_impl != (Expression *)0x0) {
          (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_80._M_head_impl = (Expression *)0x0;
        if (lower_index.index != 0) {
          (**(code **)(*(long *)lower_index.index + 8))();
        }
        p_Var8 = local_78[1]._M_parent;
        p_Var3 = local_78[1]._M_left;
      }
      lower_index.index = 0xffffffffffffffff;
      upper_index.index = 0xffffffffffffffff;
      lower_inclusive = false;
      upper_inclusive = false;
      for (uVar9 = 0; p_Var7 = local_78,
          uVar9 < (ulong)(((long)local_40[1]._M_left - (long)local_40[1]._M_parent) / 0x48);
          uVar9 = uVar9 + 1) {
        pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                           ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                            this_02,uVar9);
        args = &pvVar5->comparison_type;
        switch(pvVar5->comparison_type) {
        case COMPARE_LESSTHAN:
        case COMPARE_LESSTHANOREQUALTO:
          optional_idx::optional_idx((optional_idx *)&local_c8,uVar9);
          upper_index.index = (idx_t)local_c8;
          upper_inclusive = *args == COMPARE_LESSTHANOREQUALTO;
          break;
        case COMPARE_GREATERTHAN:
        case COMPARE_GREATERTHANOREQUALTO:
          optional_idx::optional_idx((optional_idx *)&local_c8,uVar9);
          lower_index.index = (idx_t)local_c8;
          lower_inclusive = *args == COMPARE_GREATERTHANOREQUALTO;
          break;
        default:
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                    ((duckdb *)&local_c8,&pvVar5->constant);
          pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                             ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,
                              __n);
          (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_d0);
          make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                    ((duckdb *)&local_d8,args,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_d0,
                     (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                      *)&local_c8);
          if (local_d0._M_head_impl != (Expression *)0x0) {
            (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_88._M_head_impl = &(local_d8._M_head_impl)->super_Expression;
          local_d8._M_head_impl = (BoundConstantExpression *)0x0;
          ::std::
          function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
          ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)&local_88);
          if ((BoundConstantExpression *)local_88._M_head_impl != (BoundConstantExpression *)0x0) {
            (*(((Expression *)&(local_88._M_head_impl)->super_BaseExpression)->super_BaseExpression)
              ._vptr_BaseExpression[1])();
          }
          local_88._M_head_impl = (Expression *)0x0;
          if (local_d8._M_head_impl != (BoundConstantExpression *)0x0) {
            (*((local_d8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
              [1])();
          }
          if (local_c8 != (long *)0x0) {
            (**(code **)(*local_c8 + 8))();
          }
        }
      }
      if (lower_index.index == 0xffffffffffffffff) break;
      if (upper_index.index == 0xffffffffffffffff) {
        iVar6 = optional_idx::GetIndex(&lower_index);
        pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                           ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                            this_02,iVar6);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                  ((duckdb *)&local_c8,&pvVar5->constant);
        iVar6 = optional_idx::GetIndex(&lower_index);
        p_Var7 = local_78;
        pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                           ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                            this_02,iVar6);
        pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,__n)
        ;
        (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_d0);
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  ((duckdb *)&local_d8,&pvVar5->comparison_type,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_d0,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&local_c8);
        if (local_d0._M_head_impl != (Expression *)0x0) {
          (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_98._M_head_impl = &(local_d8._M_head_impl)->super_Expression;
        local_d8._M_head_impl = (BoundConstantExpression *)0x0;
        ::std::
        function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
        ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_98);
        if ((BoundConstantExpression *)local_98._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_98._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_98._M_head_impl = (Expression *)0x0;
      }
      else {
        iVar6 = optional_idx::GetIndex(&lower_index);
        pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                           ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                            this_02,iVar6);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                  ((duckdb *)&local_c8,&pvVar5->constant);
        iVar6 = optional_idx::GetIndex(&upper_index);
        p_Var7 = local_78;
        pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                           ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                            this_02,iVar6);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                  ((duckdb *)&local_d8,&pvVar5->constant);
        pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,__n)
        ;
        (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_58);
        make_uniq<duckdb::BoundBetweenExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,bool&,bool&>
                  ((duckdb *)&local_d0,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_58,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&local_c8,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&local_d8,&lower_inclusive,&upper_inclusive);
        if (local_58._M_head_impl != (Expression *)0x0) {
          (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_90._M_head_impl = local_d0._M_head_impl;
        local_d0._M_head_impl = (Expression *)0x0;
        ::std::
        function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
        ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_90);
        if (local_90._M_head_impl != (Expression *)0x0) {
          (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_90._M_head_impl = (Expression *)0x0;
        if (local_d0._M_head_impl != (Expression *)0x0) {
          (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      goto LAB_015bdd48;
    }
    p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
  } while( true );
  uVar9 = local_48;
  if (upper_index.index != 0xffffffffffffffff) {
    iVar6 = optional_idx::GetIndex(&upper_index);
    pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                       ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)this_02,
                        iVar6);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_c8,&pvVar5->constant)
    ;
    iVar6 = optional_idx::GetIndex(&upper_index);
    pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>
                       ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)this_02,
                        iVar6);
    pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)this_01,__n);
    (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_d0);
    make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((duckdb *)&local_d8,&pvVar5->comparison_type,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_d0,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_c8);
    if (local_d0._M_head_impl != (Expression *)0x0) {
      (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_a0._M_head_impl = &(local_d8._M_head_impl)->super_Expression;
    local_d8._M_head_impl = (BoundConstantExpression *)0x0;
    ::std::
    function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
    ::operator()(callback,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_a0);
    if ((BoundConstantExpression *)local_a0._M_head_impl != (BoundConstantExpression *)0x0) {
      (*(((Expression *)&(local_a0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_a0._M_head_impl = (Expression *)0x0;
LAB_015bdd48:
    if (local_d8._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_d8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    uVar9 = local_48;
    if (local_c8 != (long *)0x0) {
      (**(code **)(*local_c8 + 8))();
      uVar9 = local_48;
    }
  }
  goto LAB_015bd84c;
}

Assistant:

void FilterCombiner::GenerateFilters(const std::function<void(unique_ptr<Expression> filter)> &callback) {
	// first loop over the remaining filters
	for (auto &filter : remaining_filters) {
		callback(std::move(filter));
	}
	remaining_filters.clear();
	// now loop over the equivalence sets
	for (auto &entry : equivalence_map) {
		auto equivalence_set = entry.first;
		auto &entries = entry.second;
		auto &constant_list = constant_values.find(equivalence_set)->second;
		// for each entry generate an equality expression comparing to each other
		for (idx_t i = 0; i < entries.size(); i++) {
			for (idx_t k = i + 1; k < entries.size(); k++) {
				auto comparison = make_uniq<BoundComparisonExpression>(
				    ExpressionType::COMPARE_EQUAL, entries[i].get().Copy(), entries[k].get().Copy());
				callback(std::move(comparison));
			}
			// for each entry also create a comparison with each constant
			auto lower_index = optional_idx::Invalid();
			auto upper_index = optional_idx::Invalid();
			bool lower_inclusive = false;
			bool upper_inclusive = false;
			for (idx_t k = 0; k < constant_list.size(); k++) {
				auto &info = constant_list[k];
				if (info.comparison_type == ExpressionType::COMPARE_GREATERTHAN ||
				    info.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
					lower_index = k;
					lower_inclusive = info.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO;
				} else if (info.comparison_type == ExpressionType::COMPARE_LESSTHAN ||
				           info.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO) {
					upper_index = k;
					upper_inclusive = info.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO;
				} else {
					auto constant = make_uniq<BoundConstantExpression>(info.constant);
					auto comparison = make_uniq<BoundComparisonExpression>(
					    info.comparison_type, entries[i].get().Copy(), std::move(constant));
					callback(std::move(comparison));
				}
			}
			if (lower_index.IsValid() && upper_index.IsValid()) {
				// found both lower and upper index, create a BETWEEN expression
				auto lower_constant =
				    make_uniq<BoundConstantExpression>(constant_list[lower_index.GetIndex()].constant);
				auto upper_constant =
				    make_uniq<BoundConstantExpression>(constant_list[upper_index.GetIndex()].constant);
				auto between =
				    make_uniq<BoundBetweenExpression>(entries[i].get().Copy(), std::move(lower_constant),
				                                      std::move(upper_constant), lower_inclusive, upper_inclusive);
				callback(std::move(between));
			} else if (lower_index.IsValid()) {
				// only lower index found, create simple comparison expression
				auto constant = make_uniq<BoundConstantExpression>(constant_list[lower_index.GetIndex()].constant);
				auto comparison =
				    make_uniq<BoundComparisonExpression>(constant_list[lower_index.GetIndex()].comparison_type,
				                                         entries[i].get().Copy(), std::move(constant));
				callback(std::move(comparison));
			} else if (upper_index.IsValid()) {
				// only upper index found, create simple comparison expression
				auto constant = make_uniq<BoundConstantExpression>(constant_list[upper_index.GetIndex()].constant);
				auto comparison =
				    make_uniq<BoundComparisonExpression>(constant_list[upper_index.GetIndex()].comparison_type,
				                                         entries[i].get().Copy(), std::move(constant));
				callback(std::move(comparison));
			}
		}
	}
	stored_expressions.clear();
	equivalence_set_map.clear();
	constant_values.clear();
	equivalence_map.clear();
}